

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

void split_allocation(malloc_link_t *allocation,size_t new_size)

{
  size_t sVar1;
  malloc_link_t *pmVar2;
  malloc_link_t *newalloc;
  size_t orig_size;
  size_t new_size_local;
  malloc_link_t *allocation_local;
  
  sVar1 = (allocation->header).size;
  if (0x10 < sVar1 - new_size) {
    (allocation->header).size = new_size;
    pmVar2 = (malloc_link_t *)((long)&allocation->next + new_size);
    (pmVar2->header).size = (sVar1 - new_size) - 8;
    pmVar2->next = free_list;
    free_list = pmVar2;
  }
  return;
}

Assistant:

static void split_allocation(malloc_link_t *allocation, size_t new_size)
{
   size_t orig_size = allocation->header.size;
   malloc_link_t *newalloc;
   
   if (orig_size - new_size <= sizeof(malloc_link_t))
      return;

   allocation->header.size = new_size;
   newalloc = (malloc_link_t *) (((unsigned char *) &allocation->next) + new_size);
   newalloc->header.size = (orig_size - new_size) - sizeof(malloc_header_t);
   newalloc->next = free_list;
   free_list = newalloc;
}